

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O1

void __thiscall
GdlRuleTable::DebugRulePrecedence
          (GdlRuleTable *this,GrcManager *pcman,ostream *strmOut,int ipassBidi)

{
  ostream *poVar1;
  pointer ppGVar2;
  ulong uVar3;
  string local_50;
  
  std::__ostream_insert<char,std::char_traits<char>>(strmOut,"\nTABLE: ",8);
  GrcSymbolTableEntry::FullName_abi_cxx11_(&local_50,this->m_psymName);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (strmOut,local_50._M_dataplus._M_p,local_50._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  ppGVar2 = (this->m_vppass).super__Vector_base<GdlPass_*,_std::allocator<GdlPass_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->m_vppass).super__Vector_base<GdlPass_*,_std::allocator<GdlPass_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppGVar2) {
    uVar3 = 0;
    do {
      if (ipassBidi + -1 == ppGVar2[uVar3]->m_nGlobalID) {
        std::__ostream_insert<char,std::char_traits<char>>(strmOut,"\nPASS ",6);
        poVar1 = (ostream *)std::ostream::operator<<(strmOut,ipassBidi);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,": bidi\n",7);
      }
      GdlPass::DebugRulePrecedence
                ((this->m_vppass).super__Vector_base<GdlPass_*,_std::allocator<GdlPass_*>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar3],pcman,strmOut);
      uVar3 = uVar3 + 1;
      ppGVar2 = (this->m_vppass).super__Vector_base<GdlPass_*,_std::allocator<GdlPass_*>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar3 < (ulong)((long)(this->m_vppass).
                                   super__Vector_base<GdlPass_*,_std::allocator<GdlPass_*>_>._M_impl
                                   .super__Vector_impl_data._M_finish - (long)ppGVar2 >> 3));
  }
  return;
}

Assistant:

void GdlRuleTable::DebugRulePrecedence(GrcManager * pcman, std::ostream & strmOut, int ipassBidi)
{
	strmOut << "\nTABLE: " << m_psymName->FullName() << "\n";
	for (size_t ippass = 0; ippass < m_vppass.size(); ippass++)
	{
		if (ipassBidi - 1 == m_vppass[ippass]->GlobalID())
			strmOut << "\nPASS " << ipassBidi << ": bidi\n";

		m_vppass[ippass]->DebugRulePrecedence(pcman, strmOut);
	}
}